

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_svc_vui_parameters_extension(sps_svc_ext_t *sps_svc_ext,bs_t *b)

{
  uint32_t uVar1;
  int local_1c;
  int i;
  bs_t *b_local;
  sps_svc_ext_t *sps_svc_ext_local;
  
  uVar1 = bs_read_ue(b);
  (sps_svc_ext->vui).vui_ext_num_entries_minus1 = (unsigned_short)uVar1;
  for (local_1c = 0; local_1c <= (int)(uint)(sps_svc_ext->vui).vui_ext_num_entries_minus1;
      local_1c = local_1c + 1) {
    uVar1 = bs_read_u(b,3);
    (sps_svc_ext->vui).vui_ext_dependency_id[local_1c] = (uchar)uVar1;
    uVar1 = bs_read_u(b,4);
    (sps_svc_ext->vui).vui_ext_quality_id[local_1c] = (uchar)uVar1;
    uVar1 = bs_read_u(b,3);
    (sps_svc_ext->vui).vui_ext_temporal_id[local_1c] = (uchar)uVar1;
    uVar1 = bs_read_u1(b);
    (sps_svc_ext->vui).vui_ext_timing_info_present_flag[local_1c] = (uchar)uVar1;
    if ((sps_svc_ext->vui).vui_ext_timing_info_present_flag[local_1c] != '\0') {
      uVar1 = bs_read_u(b,0x20);
      (sps_svc_ext->vui).vui_ext_num_units_in_tick[local_1c] = uVar1;
      uVar1 = bs_read_u(b,0x20);
      (sps_svc_ext->vui).vui_ext_time_scale[local_1c] = uVar1;
      uVar1 = bs_read_u1(b);
      (sps_svc_ext->vui).vui_ext_fixed_frame_rate_flag[local_1c] = uVar1 != 0;
    }
    uVar1 = bs_read_u1(b);
    (sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[local_1c] = uVar1 != 0;
    if (((sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[local_1c] & 1U) != 0) {
      read_hrd_parameters(sps_svc_ext->hrd_vcl + local_1c,b);
    }
    uVar1 = bs_read_u1(b);
    (sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[local_1c] = uVar1 != 0;
    if (((sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[local_1c] & 1U) != 0) {
      read_hrd_parameters(sps_svc_ext->hrd_nal + local_1c,b);
    }
    if ((((sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[local_1c] & 1U) != 0) ||
       (((sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[local_1c] & 1U) != 0)) {
      uVar1 = bs_read_u1(b);
      (sps_svc_ext->vui).vui_ext_low_delay_hrd_flag[local_1c] = uVar1 != 0;
    }
    uVar1 = bs_read_u1(b);
    (sps_svc_ext->vui).vui_ext_pic_struct_present_flag[local_1c] = uVar1 != 0;
  }
  return;
}

Assistant:

void read_svc_vui_parameters_extension(sps_svc_ext_t* sps_svc_ext, bs_t* b)
{
    sps_svc_ext->vui.vui_ext_num_entries_minus1 = bs_read_ue(b);
    for( int i = 0; i <= sps_svc_ext->vui.vui_ext_num_entries_minus1; i++ )
    {
        sps_svc_ext->vui.vui_ext_dependency_id[i] = bs_read_u(b, 3);
        sps_svc_ext->vui.vui_ext_quality_id[i] = bs_read_u(b, 4);
        sps_svc_ext->vui.vui_ext_temporal_id[i] = bs_read_u(b, 3);
        sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] )
        {
            sps_svc_ext->vui.vui_ext_num_units_in_tick[i] = bs_read_u(b, 32);
            sps_svc_ext->vui.vui_ext_time_scale[i] = bs_read_u(b, 32);
            sps_svc_ext->vui.vui_ext_fixed_frame_rate_flag[i] = bs_read_u1(b);
        }

        sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] )
        {
            read_hrd_parameters(&sps_svc_ext->hrd_vcl[i], b);
        }
        sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            read_hrd_parameters(&sps_svc_ext->hrd_nal[i], b);
        }
        
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] ||
            sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            sps_svc_ext->vui.vui_ext_low_delay_hrd_flag[i] = bs_read_u1(b);
        }
        sps_svc_ext->vui.vui_ext_pic_struct_present_flag[i] = bs_read_u1(b);
    }
}